

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019cd70 = 0x2d2d2d2d2d2d2d;
    uRam000000000019cd77._0_1_ = '-';
    uRam000000000019cd77._1_1_ = '-';
    uRam000000000019cd77._2_1_ = '-';
    uRam000000000019cd77._3_1_ = '-';
    uRam000000000019cd77._4_1_ = '-';
    uRam000000000019cd77._5_1_ = '-';
    uRam000000000019cd77._6_1_ = '-';
    uRam000000000019cd77._7_1_ = '-';
    DAT_0019cd60 = '-';
    DAT_0019cd60_1._0_1_ = '-';
    DAT_0019cd60_1._1_1_ = '-';
    DAT_0019cd60_1._2_1_ = '-';
    DAT_0019cd60_1._3_1_ = '-';
    DAT_0019cd60_1._4_1_ = '-';
    DAT_0019cd60_1._5_1_ = '-';
    DAT_0019cd60_1._6_1_ = '-';
    uRam000000000019cd68 = 0x2d2d2d2d2d2d2d;
    DAT_0019cd6f = 0x2d;
    DAT_0019cd50 = '-';
    DAT_0019cd50_1._0_1_ = '-';
    DAT_0019cd50_1._1_1_ = '-';
    DAT_0019cd50_1._2_1_ = '-';
    DAT_0019cd50_1._3_1_ = '-';
    DAT_0019cd50_1._4_1_ = '-';
    DAT_0019cd50_1._5_1_ = '-';
    DAT_0019cd50_1._6_1_ = '-';
    uRam000000000019cd58._0_1_ = '-';
    uRam000000000019cd58._1_1_ = '-';
    uRam000000000019cd58._2_1_ = '-';
    uRam000000000019cd58._3_1_ = '-';
    uRam000000000019cd58._4_1_ = '-';
    uRam000000000019cd58._5_1_ = '-';
    uRam000000000019cd58._6_1_ = '-';
    uRam000000000019cd58._7_1_ = '-';
    DAT_0019cd40 = '-';
    DAT_0019cd40_1._0_1_ = '-';
    DAT_0019cd40_1._1_1_ = '-';
    DAT_0019cd40_1._2_1_ = '-';
    DAT_0019cd40_1._3_1_ = '-';
    DAT_0019cd40_1._4_1_ = '-';
    DAT_0019cd40_1._5_1_ = '-';
    DAT_0019cd40_1._6_1_ = '-';
    uRam000000000019cd48._0_1_ = '-';
    uRam000000000019cd48._1_1_ = '-';
    uRam000000000019cd48._2_1_ = '-';
    uRam000000000019cd48._3_1_ = '-';
    uRam000000000019cd48._4_1_ = '-';
    uRam000000000019cd48._5_1_ = '-';
    uRam000000000019cd48._6_1_ = '-';
    uRam000000000019cd48._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019cd38._0_1_ = '-';
    uRam000000000019cd38._1_1_ = '-';
    uRam000000000019cd38._2_1_ = '-';
    uRam000000000019cd38._3_1_ = '-';
    uRam000000000019cd38._4_1_ = '-';
    uRam000000000019cd38._5_1_ = '-';
    uRam000000000019cd38._6_1_ = '-';
    uRam000000000019cd38._7_1_ = '-';
    DAT_0019cd7f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}